

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcGeometricRepresentationContext::~IfcGeometricRepresentationContext
          (IfcGeometricRepresentationContext *this)

{
  ~IfcGeometricRepresentationContext
            ((IfcGeometricRepresentationContext *)
             &this[-1].super_IfcRepresentationContext.field_0x60);
  return;
}

Assistant:

IfcGeometricRepresentationContext() : Object("IfcGeometricRepresentationContext") {}